

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int lua_getiuservalue(lua_State *L,int idx,int n)

{
  lua_CFunction p_Var1;
  StkId pSVar2;
  uint uVar3;
  TValue *pTVar4;
  long lVar5;
  
  if (0 < n) {
    pTVar4 = index2value(L,idx);
    p_Var1 = (pTVar4->value_).f;
    if (n <= (int)(uint)*(ushort *)(p_Var1 + 10)) {
      pSVar2 = (L->top).p;
      lVar5 = (ulong)(n - 1) * 0x10;
      (pSVar2->val).value_ = *(Value *)(p_Var1 + lVar5 + 0x28);
      (pSVar2->val).tt_ = (lu_byte)p_Var1[lVar5 + 0x30];
      uVar3 = *(byte *)((L->top).offset + 8) & 0xf;
      goto LAB_00105a71;
    }
  }
  *(undefined1 *)((L->top).offset + 8) = 0;
  uVar3 = 0xffffffff;
LAB_00105a71:
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return uVar3;
}

Assistant:

LUA_API int lua_getiuservalue (lua_State *L, int idx, int n) {
  TValue *o;
  int t;
  lua_lock(L);
  o = index2value(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  if (n <= 0 || n > uvalue(o)->nuvalue) {
    setnilvalue(s2v(L->top.p));
    t = LUA_TNONE;
  }
  else {
    setobj2s(L, L->top.p, &uvalue(o)->uv[n - 1].uv);
    t = ttype(s2v(L->top.p));
  }
  api_incr_top(L);
  lua_unlock(L);
  return t;
}